

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChArchiveExplorer.h
# Opt level: O3

void __thiscall
chrono::ChArchiveExplorer::out_array_end(ChArchiveExplorer *this,ChValue *bVal,size_t msize)

{
  uint *puVar1;
  _Bit_iterator *p_Var2;
  uint uVar3;
  int iVar4;
  int iVar5;
  ulong uVar6;
  
  iVar4 = this->tablevel;
  uVar6 = (ulong)iVar4;
  iVar5 = iVar4 + 0x3f;
  if (-1 < (long)uVar6) {
    iVar5 = iVar4;
  }
  if (((this->in_array).super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
       _M_start.super__Bit_iterator_base._M_p
       [(long)(iVar5 >> 6) +
        (ulong)((uVar6 & 0x800000000000003f) < 0x8000000000000001) + 0xffffffffffffffff] >>
       (uVar6 & 0x3f) & 1) != 0) {
    this->tablevel = iVar4 + -1;
    puVar1 = &(this->in_array).super__Bvector_base<std::allocator<bool>_>._M_impl.
              super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset;
    uVar3 = *puVar1;
    *puVar1 = *puVar1 - 1;
    if (uVar3 == 0) {
      (this->in_array).super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
      _M_finish.super__Bit_iterator_base._M_offset = 0x3f;
      p_Var2 = &(this->in_array).super__Bvector_base<std::allocator<bool>_>._M_impl.
                super__Bvector_impl_data._M_finish;
      (p_Var2->super__Bit_iterator_base)._M_p = (p_Var2->super__Bit_iterator_base)._M_p + -1;
    }
  }
  return;
}

Assistant:

virtual void out_array_end (ChValue& bVal, size_t msize) {
            if (in_array[tablevel] == true) {
                --tablevel; 
                in_array.pop_back();
            }
      }